

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeDoubleRegLoad(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DecodeStatus DVar5;
  MCInst *in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  uint pred;
  uint Rn;
  uint Rt;
  DecodeStatus S;
  uint RegNo;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  RegNo = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar4 = fieldFromInstruction_4(in_ESI,0x1c,4);
  if (uVar3 == 0xf) {
    local_4 = MCDisassembler_SoftFail;
  }
  DVar5 = DecodeGPRPairRegisterClass
                    ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,(uint64_t)in_RCX,
                     (void *)CONCAT44(local_4,uVar2));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
  if (_Var1) {
    DVar5 = DecodeGPRRegisterClass
                      ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,(uint64_t)in_RCX,
                       (void *)CONCAT44(local_4,uVar2));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
    if (_Var1) {
      DVar5 = DecodePredicateOperand(in_RCX,local_4,CONCAT44(uVar3,uVar4),(void *)0x27a20d);
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
      if (!_Var1) {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeDoubleRegLoad(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);

	if (Rn == 0xF)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRPairRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}